

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O0

void __thiscall Peer::disconnect(Peer *this,bool suppressException)

{
  Socket __fd;
  PeerException *this_00;
  int *piVar1;
  char *__rhs;
  Events *this_01;
  unique_ptr<Event,_std::default_delete<Event>_> *this_02;
  pointer this_03;
  Peers *this_04;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  byte local_11;
  int shutdown;
  bool suppressException_local;
  Peer *this_local;
  
  local_11 = suppressException;
  _shutdown = this;
  __fd = SocketResource::resource(&this->m_socket);
  local_18 = ::shutdown(__fd,2);
  if ((local_18 == -1) && ((local_11 & 1) == 0)) {
    this_00 = (PeerException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Failed to shutdown socket to peer ",&local_b9);
    std::operator+(&local_98,&local_b8,&this->m_name);
    std::operator+(&local_78,&local_98," ");
    piVar1 = __errno_location();
    __rhs = strerror(*piVar1);
    std::operator+(&local_58,&local_78,__rhs);
    std::operator+(&local_38,&local_58,"\n");
    PeerException::PeerException(this_00,&local_38);
    __cxa_throw(this_00,&PeerException::typeinfo,PeerException::~PeerException);
  }
  this->m_connected = false;
  this_01 = P2PSocket::events(this->m_master);
  this_02 = Events::onPeerDisconnect(this_01);
  this_03 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(this_02);
  Event::trigger<Peer*>(this_03,this);
  this_04 = P2PSocket::peers(this->m_master);
  Peers::remove(this_04,(char *)this);
  return;
}

Assistant:

void Peer::disconnect(bool suppressException)
{
    int shutdown = ::shutdown(m_socket.resource(), SHUT_RDWR);
    if (shutdown == -1 && !suppressException) {
        throw PeerException(std::string{"Failed to shutdown socket to peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }

    // Don't call close here, it will be triggered automatically when object gets destroyed
    m_connected = false;
    this->m_master->events()->onPeerDisconnect()->trigger(this);
    this->m_master->peers()->remove(this);
}